

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_serialize_tofile(FILE *out)

{
  uint8_t uVar1;
  uint32_t value;
  avl_iter_t *iter;
  lddmc_ser *plVar2;
  uint64_t uVar3;
  mddnode_t right_00;
  mddnode_t down_00;
  bool bVar4;
  uint64_t down;
  uint64_t right;
  mddnode node;
  mddnode_t n;
  size_t index;
  avl_iter_t *it;
  lddmc_ser *s;
  size_t count;
  FILE *out_local;
  
  count = (size_t)out;
  s = (lddmc_ser *)avl_count(lddmc_ser_reversed_set);
  if (s < lddmc_ser_done) {
    __assert_fail("count >= lddmc_ser_done",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                  ,0x9f2,"void lddmc_serialize_tofile(FILE *)");
  }
  if (s != (lddmc_ser *)(lddmc_ser_counter - 2)) {
    __assert_fail("count == lddmc_ser_counter-2",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                  ,0x9f3,"void lddmc_serialize_tofile(FILE *)");
  }
  s = (lddmc_ser *)((long)s - lddmc_ser_done);
  fwrite(&s,8,1,(FILE *)count);
  iter = lddmc_ser_reversed_iter(lddmc_ser_reversed_set);
  n = (mddnode_t)0x0;
  while( true ) {
    bVar4 = false;
    if (n < lddmc_ser_done) {
      it = (avl_iter_t *)lddmc_ser_reversed_iter_next(iter);
      bVar4 = (lddmc_ser *)it != (lddmc_ser *)0x0;
    }
    if (!bVar4) break;
    if ((undefined1 *)it[1].height != (undefined1 *)((long)&n->a + 2)) {
      __assert_fail("s->assigned == index+2",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x9fd,"void lddmc_serialize_tofile(FILE *)");
    }
    n = (mddnode_t)((long)&n->a + 1);
  }
  while( true ) {
    plVar2 = lddmc_ser_reversed_iter_next(iter);
    if (plVar2 == (lddmc_ser *)0x0) {
      lddmc_ser_done = lddmc_ser_counter - 2;
      lddmc_ser_reversed_iter_free(iter);
      return;
    }
    if ((undefined1 *)plVar2->assigned != (undefined1 *)((long)&n->a + 2U)) break;
    n = (mddnode_t)((long)&n->a + 1);
    node.b = (uint64_t)LDD_GETNODE(plVar2->mdd);
    uVar3 = mddnode_getright((mddnode_t)node.b);
    right_00 = (mddnode_t)lddmc_serialize_get(uVar3);
    uVar3 = mddnode_getdown((mddnode_t)node.b);
    down_00 = (mddnode_t)lddmc_serialize_get(uVar3);
    uVar1 = mddnode_getcopy((mddnode_t)node.b);
    if (uVar1 == '\0') {
      value = mddnode_getvalue((mddnode_t)node.b);
      mddnode_make((mddnode_t)&right,value,(uint64_t)right_00,(uint64_t)down_00);
    }
    else {
      mddnode_makecopy((mddnode_t)&right,(uint64_t)right_00,(uint64_t)down_00);
    }
    if (n < right_00) {
      __assert_fail("right <= index",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0xa0d,"void lddmc_serialize_tofile(FILE *)");
    }
    if (n < down_00) {
      __assert_fail("down <= index",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0xa0e,"void lddmc_serialize_tofile(FILE *)");
    }
    fwrite(&right,0x10,1,(FILE *)count);
  }
  __assert_fail("s->assigned == index+2",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                ,0xa02,"void lddmc_serialize_tofile(FILE *)");
}

Assistant:

void
lddmc_serialize_tofile(FILE *out)
{
    size_t count = avl_count(lddmc_ser_reversed_set);
    assert(count >= lddmc_ser_done);
    assert(count == lddmc_ser_counter-2);
    count -= lddmc_ser_done;
    fwrite(&count, sizeof(size_t), 1, out);

    struct lddmc_ser *s;
    avl_iter_t *it = lddmc_ser_reversed_iter(lddmc_ser_reversed_set);

    /* Skip already written entries */
    size_t index = 0;
    while (index < lddmc_ser_done && (s=lddmc_ser_reversed_iter_next(it))) {
        assert(s->assigned == index+2);
        index++;
    }

    while ((s=lddmc_ser_reversed_iter_next(it))) {
        assert(s->assigned == index+2);
        index++;

        mddnode_t n = LDD_GETNODE(s->mdd);

        struct mddnode node;
        uint64_t right = lddmc_serialize_get(mddnode_getright(n));
        uint64_t down = lddmc_serialize_get(mddnode_getdown(n));
        if (mddnode_getcopy(n)) mddnode_makecopy(&node, right, down);
        else mddnode_make(&node, mddnode_getvalue(n), right, down);

        assert(right <= index);
        assert(down <= index);

        fwrite(&node, sizeof(struct mddnode), 1, out);
    }

    lddmc_ser_done = lddmc_ser_counter-2;
    lddmc_ser_reversed_iter_free(it);
}